

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O3

spv_result_t
spvtools::val::ValidateMemoryScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Instruction *pIVar2;
  ValidationState_t *this;
  undefined4 uVar3;
  _Head_base<1UL,_bool,_false> _Var4;
  bool bVar5;
  spv_result_t sVar6;
  MemoryModel MVar7;
  DiagnosticStream *pDVar8;
  Function *pFVar9;
  long lVar10;
  char *pcVar11;
  Op opcode;
  string errorVUID;
  string local_2a0;
  Instruction *local_280;
  ValidationState_t *local_278;
  char *local_270;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  undefined1 local_208 [8];
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [28];
  spv_result_t local_38;
  
  opcode = (Op)(inst->inst_).opcode;
  ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,scope);
  uVar3 = local_208._0_4_;
  _Var4._M_head_impl = local_208[4];
  sVar6 = ValidateScope(_,inst,scope);
  if (sVar6 != SPV_SUCCESS) {
    return sVar6;
  }
  if (_Var4._M_head_impl == false) {
    return SPV_SUCCESS;
  }
  local_280 = inst;
  local_278 = _;
  if (uVar3 == 1) {
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVulkanMemoryModel)
    ;
    if ((bVar5) &&
       (bVar5 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityVulkanMemoryModelDeviceScope), !bVar5)
       ) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "Use of device scope with VulkanKHR memory model requires the ",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"VulkanMemoryModelDeviceScopeKHR capability",0x2a);
      goto LAB_0019a44c;
    }
  }
  else if (uVar3 == 5) {
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVulkanMemoryModel)
    ;
    if (bVar5) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_280);
    local_2a0._M_dataplus._M_p = spvOpcodeString(opcode);
    pDVar8 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar8,": Memory Scope QueueFamilyKHR requires capability ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar8,"VulkanMemoryModelKHR",0x14);
    local_38 = pDVar8->error_;
    goto LAB_0019a44c;
  }
  bVar5 = spvIsVulkanEnv(_->context_->target_env);
  pIVar2 = local_280;
  if (!bVar5) {
    return SPV_SUCCESS;
  }
  if ((uVar3 - 1 < 4) || (uVar3 == 6)) {
    if ((uVar3 != 3) || (_->context_->target_env != SPV_ENV_VULKAN_1_0)) {
      if (uVar3 == 2) {
        ValidationState_t::VkErrorID_abi_cxx11_((string *)local_208,_,0x1c99,(char *)0x0);
        pIVar2 = local_280;
        pFVar9 = ValidationState_t::function(_,local_280->function_->id_);
        paVar1 = &local_2a0.field_2;
        local_2a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a0,CONCAT44(local_208._4_4_,local_208._0_4_),
                   local_200 + CONCAT44(local_208._4_4_,local_208._0_4_));
        local_248._8_8_ = 0;
        local_248._M_unused._M_object = operator_new(0x20);
        *(code **)local_248._M_unused._0_8_ = (code *)((long)local_248._M_unused._0_8_ + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p == paVar1) {
          *(long *)((long)local_248._M_unused._0_8_ + 0x10) =
               CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                        local_2a0.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x18) = local_2a0.field_2._8_8_;
        }
        else {
          *(pointer *)local_248._M_unused._0_8_ = local_2a0._M_dataplus._M_p;
          *(long *)((long)local_248._M_unused._0_8_ + 0x10) =
               CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                        local_2a0.field_2._M_local_buf[0]);
        }
        *(size_type *)((long)local_248._M_unused._0_8_ + 8) = local_2a0._M_string_length;
        local_2a0._M_string_length = 0;
        local_2a0.field_2._M_local_buf[0] = '\0';
        local_230 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:279:15)>
                    ::_M_invoke;
        local_238 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:279:15)>
                    ::_M_manager;
        local_2a0._M_dataplus._M_p = (pointer)paVar1;
        Function::RegisterExecutionModelLimitation
                  (pFVar9,(function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                           *)&local_248);
        if (local_238 != (code *)0x0) {
          (*local_238)(&local_248,&local_248,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                   local_2a0.field_2._M_local_buf[0]) + 1);
        }
        this = local_278;
        MVar7 = ValidationState_t::memory_model(local_278);
        if (MVar7 != GLSL450) goto LAB_0019a721;
        ValidationState_t::VkErrorID_abi_cxx11_(&local_2a0,this,0x1c98,(char *)0x0);
        std::__cxx11::string::operator=((string *)local_208,(string *)&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                   local_2a0.field_2._M_local_buf[0]) + 1);
        }
        pFVar9 = ValidationState_t::function(local_278,pIVar2->function_->id_);
        local_2a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a0,CONCAT44(local_208._4_4_,local_208._0_4_),
                   local_200 + CONCAT44(local_208._4_4_,local_208._0_4_));
        local_268._8_8_ = 0;
        local_268._M_unused._M_object = operator_new(0x20);
        *(code **)local_268._M_unused._0_8_ = (code *)((long)local_268._M_unused._0_8_ + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p == paVar1) {
          *(long *)((long)local_268._M_unused._0_8_ + 0x10) =
               CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                        local_2a0.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_268._M_unused._0_8_ + 0x18) = local_2a0.field_2._8_8_;
        }
        else {
          *(pointer *)local_268._M_unused._0_8_ = local_2a0._M_dataplus._M_p;
          *(long *)((long)local_268._M_unused._0_8_ + 0x10) =
               CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                        local_2a0.field_2._M_local_buf[0]);
        }
        *(size_type *)((long)local_268._M_unused._0_8_ + 8) = local_2a0._M_string_length;
        local_2a0._M_string_length = 0;
        local_2a0.field_2._M_local_buf[0] = '\0';
        local_250 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:301:17)>
                    ::_M_invoke;
        local_258 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:301:17)>
                    ::_M_manager;
        local_2a0._M_dataplus._M_p = (pointer)paVar1;
        Function::RegisterExecutionModelLimitation
                  (pFVar9,(function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                           *)&local_268);
        if (local_258 != (code *)0x0) {
          (*local_258)(&local_268,&local_268,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p == paVar1) goto LAB_0019a721;
      }
      else {
        if (uVar3 != 6) {
          return SPV_SUCCESS;
        }
        ValidationState_t::VkErrorID_abi_cxx11_((string *)local_208,_,0x1220,(char *)0x0);
        pFVar9 = ValidationState_t::function(_,pIVar2->function_->id_);
        paVar1 = &local_2a0.field_2;
        local_2a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a0,CONCAT44(local_208._4_4_,local_208._0_4_),
                   local_200 + CONCAT44(local_208._4_4_,local_208._0_4_));
        local_228._8_8_ = 0;
        local_228._M_unused._M_object = operator_new(0x20);
        *(code **)local_228._M_unused._0_8_ = (code *)((long)local_228._M_unused._0_8_ + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p == paVar1) {
          *(long *)((long)local_228._M_unused._0_8_ + 0x10) =
               CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                        local_2a0.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x18) = local_2a0.field_2._8_8_;
        }
        else {
          *(pointer *)local_228._M_unused._0_8_ = local_2a0._M_dataplus._M_p;
          *(long *)((long)local_228._M_unused._0_8_ + 0x10) =
               CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                        local_2a0.field_2._M_local_buf[0]);
        }
        *(size_type *)((long)local_228._M_unused._0_8_ + 8) = local_2a0._M_string_length;
        local_2a0._M_string_length = 0;
        local_2a0.field_2._M_local_buf[0] = '\0';
        local_210 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:256:15)>
                    ::_M_invoke;
        local_218 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:256:15)>
                    ::_M_manager;
        local_2a0._M_dataplus._M_p = (pointer)paVar1;
        Function::RegisterExecutionModelLimitation
                  (pFVar9,(function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                           *)&local_228);
        if (local_218 != (code *)0x0) {
          (*local_218)(&local_228,&local_228,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p == paVar1) goto LAB_0019a721;
      }
      operator_delete(local_2a0._M_dataplus._M_p,
                      CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                               local_2a0.field_2._M_local_buf[0]) + 1);
LAB_0019a721:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_208._4_4_,local_208._0_4_) != local_1f8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_208._4_4_,local_208._0_4_),
                        local_1f8[0]._M_allocated_capacity + 1);
      }
      return SPV_SUCCESS;
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilitySubgroupBallotKHR)
    ;
    if (bVar5) {
      return SPV_SUCCESS;
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilitySubgroupVoteKHR);
    if (bVar5) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_280);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_2a0,_,0x1f0f,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    local_270 = spvOpcodeString(opcode);
    pDVar8 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_270);
    pcVar11 = 
    ": in Vulkan 1.0 environment Memory Scope is can not be Subgroup without SubgroupBallotKHR or SubgroupVoteKHR declared"
    ;
    lVar10 = 0x75;
  }
  else {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_280);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_2a0,_,0x121e,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    local_270 = spvOpcodeString(opcode);
    pDVar8 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_270);
    pcVar11 = 
    ": in Vulkan environment Memory Scope is limited to Device, QueueFamily, Workgroup, ShaderCallKHR, Subgroup, or Invocation"
    ;
    lVar10 = 0x79;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8,pcVar11,lVar10);
  local_38 = pDVar8->error_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                             local_2a0.field_2._M_local_buf[0]) + 1);
  }
LAB_0019a44c:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t ValidateMemoryScope(ValidationState_t& _, const Instruction* inst,
                                 uint32_t scope) {
  const spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t tmp_value = 0;
  std::tie(is_int32, is_const_int32, tmp_value) = _.EvalInt32IfConst(scope);

  if (auto error = ValidateScope(_, inst, scope)) {
    return error;
  }

  if (!is_const_int32) {
    return SPV_SUCCESS;
  }

  spv::Scope value = spv::Scope(tmp_value);

  if (value == spv::Scope::QueueFamilyKHR) {
    if (_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
      return SPV_SUCCESS;
    } else {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << spvOpcodeString(opcode)
             << ": Memory Scope QueueFamilyKHR requires capability "
             << "VulkanMemoryModelKHR";
    }
  }

  if (value == spv::Scope::Device &&
      _.HasCapability(spv::Capability::VulkanMemoryModelKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelDeviceScopeKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Use of device scope with VulkanKHR memory model requires the "
           << "VulkanMemoryModelDeviceScopeKHR capability";
  }

  // Vulkan Specific rules
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (value != spv::Scope::Device && value != spv::Scope::Workgroup &&
        value != spv::Scope::Subgroup && value != spv::Scope::Invocation &&
        value != spv::Scope::ShaderCallKHR &&
        value != spv::Scope::QueueFamily) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4638) << spvOpcodeString(opcode)
             << ": in Vulkan environment Memory Scope is limited to Device, "
                "QueueFamily, Workgroup, ShaderCallKHR, Subgroup, or "
                "Invocation";
    } else if (_.context()->target_env == SPV_ENV_VULKAN_1_0 &&
               value == spv::Scope::Subgroup &&
               !_.HasCapability(spv::Capability::SubgroupBallotKHR) &&
               !_.HasCapability(spv::Capability::SubgroupVoteKHR)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(7951) << spvOpcodeString(opcode)
             << ": in Vulkan 1.0 environment Memory Scope is can not be "
                "Subgroup without SubgroupBallotKHR or SubgroupVoteKHR "
                "declared";
    }

    if (value == spv::Scope::ShaderCallKHR) {
      std::string errorVUID = _.VkErrorID(4640);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR &&
                    model != spv::ExecutionModel::IntersectionKHR &&
                    model != spv::ExecutionModel::AnyHitKHR &&
                    model != spv::ExecutionModel::ClosestHitKHR &&
                    model != spv::ExecutionModel::MissKHR &&
                    model != spv::ExecutionModel::CallableKHR) {
                  if (message) {
                    *message =
                        errorVUID +
                        "ShaderCallKHR Memory Scope requires a ray tracing "
                        "execution model";
                  }
                  return false;
                }
                return true;
              });
    }

    if (value == spv::Scope::Workgroup) {
      std::string errorVUID = _.VkErrorID(7321);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::GLCompute &&
                    model != spv::ExecutionModel::TessellationControl &&
                    model != spv::ExecutionModel::TaskNV &&
                    model != spv::ExecutionModel::MeshNV &&
                    model != spv::ExecutionModel::TaskEXT &&
                    model != spv::ExecutionModel::MeshEXT) {
                  if (message) {
                    *message = errorVUID +
                               "Workgroup Memory Scope is limited to MeshNV, "
                               "TaskNV, MeshEXT, TaskEXT, TessellationControl, "
                               "and GLCompute execution model";
                  }
                  return false;
                }
                return true;
              });

      if (_.memory_model() == spv::MemoryModel::GLSL450) {
        errorVUID = _.VkErrorID(7320);
        _.function(inst->function()->id())
            ->RegisterExecutionModelLimitation(
                [errorVUID](spv::ExecutionModel model, std::string* message) {
                  if (model == spv::ExecutionModel::TessellationControl) {
                    if (message) {
                      *message =
                          errorVUID +
                          "Workgroup Memory Scope can't be used with "
                          "TessellationControl using GLSL450 Memory Model";
                    }
                    return false;
                  }
                  return true;
                });
      }
    }
  }

  // TODO(atgoo@github.com) Add checks for OpenCL and OpenGL environments.

  return SPV_SUCCESS;
}